

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistwidget.cpp
# Opt level: O1

void __thiscall QListWidgetItem::setSelected(QListWidgetItem *this,bool select)

{
  SelectionMode SVar1;
  QListModel *__s;
  QItemSelectionModel *pQVar2;
  byte bVar3;
  long in_FS_OFFSET;
  undefined1 *local_48;
  undefined1 *puStack_40;
  Data *local_38;
  QListWidgetItem **local_30;
  
  local_30 = *(QListWidgetItem ***)(in_FS_OFFSET + 0x28);
  __s = listModel(this);
  if (__s != (QListModel *)0x0) {
    pQVar2 = QAbstractItemView::selectionModel((QAbstractItemView *)this->view);
    if (pQVar2 != (QItemSelectionModel *)0x0) {
      SVar1 = QAbstractItemView::selectionMode((QAbstractItemView *)this->view);
      if (SVar1 != NoSelection) {
        local_38 = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        local_48 = &DAT_aaaaaaaaaaaaaaaa;
        puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
        QListModel::index((QListModel *)&local_48,(char *)__s,(int)this);
        pQVar2 = QAbstractItemView::selectionModel((QAbstractItemView *)this->view);
        bVar3 = 4;
        if (select) {
          bVar3 = SVar1 == SingleSelection | 2;
        }
        (**(code **)(*(long *)pQVar2 + 0x68))(pQVar2,&local_48,bVar3);
      }
    }
  }
  if (*(QListWidgetItem ***)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QListWidgetItem::setSelected(bool select)
{
    const QListModel *model = listModel();
    if (!model || !view->selectionModel())
        return;
    const QAbstractItemView::SelectionMode selectionMode = view->selectionMode();
    if (selectionMode == QAbstractItemView::NoSelection)
        return;
    const QModelIndex index = model->index(this);
    if (selectionMode == QAbstractItemView::SingleSelection)
        view->selectionModel()->select(index, select
                                       ? QItemSelectionModel::ClearAndSelect
                                       : QItemSelectionModel::Deselect);
    else
        view->selectionModel()->select(index, select
                                       ? QItemSelectionModel::Select
                                       : QItemSelectionModel::Deselect);
}